

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yyText(GREG *G,int begin,int end)

{
  size_t __size;
  char *pcVar1;
  uint uVar2;
  
  uVar2 = end - begin;
  if (uVar2 == 0 || end < begin) {
    uVar2 = 0;
  }
  else {
    while (G->textlen <= (int)uVar2) {
      __size = (long)G->textlen * 2;
      G->textlen = (int)__size;
      pcVar1 = (char *)realloc(G->text,__size);
      G->text = pcVar1;
    }
    memcpy(G->text,G->buf + begin,(ulong)uVar2);
  }
  G->text[uVar2] = '\0';
  return uVar2;
}

Assistant:

YY_LOCAL(int) yyText(GREG *G, int begin, int end)
{
  int yyleng= end - begin;
  if (yyleng <= 0)
    yyleng= 0;
  else
    {
      while (G->textlen < (yyleng + 1))
        {
          G->textlen *= 2;
          G->text= (char*)YY_REALLOC(G->text, G->textlen, G->data);
        }
      memcpy(G->text, G->buf + begin, yyleng);
    }
  G->text[yyleng]= '\0';
  return yyleng;
}